

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QUnicodeControlCharacterMenu::menuActionTriggered(QUnicodeControlCharacterMenu *this)

{
  QObject *object;
  qsizetype qVar1;
  QTextEdit *this_00;
  QWidgetTextControl *this_01;
  QLineEdit *this_02;
  long in_FS_OFFSET;
  QAction *a;
  QArrayDataPointer<QAction_*> local_48;
  QAction *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  object = (QObject *)QObject::sender();
  local_28 = QtPrivate::qobject_cast_helper<QAction*,QObject>(object);
  QWidget::actions((QList<QAction_*> *)&local_48,(QWidget *)this);
  qVar1 = QtPrivate::indexOf<QAction*,QAction*>((QList<QAction_*> *)&local_48,&local_28,0);
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_48);
  if ((uint)qVar1 < 0xe) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_48,
                     (QChar)(char16_t)
                            *(undefined4 *)
                             ((long)&qt_controlCharacters[0].character +
                             (ulong)(((uint)qVar1 & 0xf) << 4)));
    this_00 = QtPrivate::qobject_cast_helper<QTextEdit*,QObject>(*(QObject **)(this + 0x28));
    if (this_00 == (QTextEdit *)0x0) {
      this_01 = (QWidgetTextControl *)
                QtPrivate::qobject_cast_helper<QWidgetTextControl*,QObject>
                          (*(QObject **)(this + 0x28));
      if (this_01 != (QWidgetTextControl *)0x0) {
        QWidgetTextControl::insertPlainText(this_01,(QString *)&local_48);
      }
      this_02 = QtPrivate::qobject_cast_helper<QLineEdit*,QObject>(*(QObject **)(this + 0x28));
      if (this_02 != (QLineEdit *)0x0) {
        QLineEdit::insert(this_02,(QString *)&local_48);
      }
    }
    else {
      QTextEdit::insertPlainText(this_00,(QString *)&local_48);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnicodeControlCharacterMenu::menuActionTriggered()
{
    QAction *a = qobject_cast<QAction *>(sender());
    int idx = actions().indexOf(a);
    if (idx < 0 || idx >= NUM_CONTROL_CHARACTERS)
        return;
    QChar c(qt_controlCharacters[idx].character);
    QString str(c);

#if QT_CONFIG(textedit)
    if (QTextEdit *edit = qobject_cast<QTextEdit *>(editWidget)) {
        edit->insertPlainText(str);
        return;
    }
#endif
    if (QWidgetTextControl *control = qobject_cast<QWidgetTextControl *>(editWidget)) {
        control->insertPlainText(str);
    }
#if QT_CONFIG(lineedit)
    if (QLineEdit *edit = qobject_cast<QLineEdit *>(editWidget)) {
        edit->insert(str);
        return;
    }
#endif
}